

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffix_array.hpp
# Opt level: O3

vector<unsigned_long,_std::allocator<unsigned_long>_> *
alphabet_histogram<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,unsigned_long>
          (vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          begin,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                end,comm *comm)

{
  long *plVar1;
  pointer puVar2;
  void *__s;
  value_type_conflict1 *__val;
  custom_op<unsigned_long,_true> op;
  custom_op<unsigned_long,_true> cStack_68;
  
  __s = operator_new(0x800);
  memset(__s,0,0x800);
  for (; begin._M_current != end._M_current; begin._M_current = begin._M_current + 1) {
    plVar1 = (long *)((long)__s + (ulong)(byte)*begin._M_current * 8);
    *plVar1 = *plVar1 + 1;
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (__return_storage_ptr__,0x100,(allocator_type *)&cStack_68);
  puVar2 = (__return_storage_ptr__->
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  mxx::custom_op<unsigned_long,true>::custom_op<std::plus<unsigned_long>>
            ((custom_op<unsigned_long,true> *)&cStack_68);
  MPI_Allreduce(__s,puVar2,0x100,cStack_68.m_type_copy,cStack_68.m_op,comm->mpi_comm);
  mxx::custom_op<unsigned_long,_true>::~custom_op(&cStack_68);
  operator_delete(__s);
  return __return_storage_ptr__;
}

Assistant:

std::vector<index_t> alphabet_histogram(InputIterator begin, InputIterator end, const mxx::comm& comm) {
    static_assert(std::is_same<typename std::iterator_traits<InputIterator>::value_type, char>::value, "Iterator must be of value type `char`.");
    // get local histogram of alphabet characters
    std::vector<index_t> hist = get_histogram<index_t>(begin, end, 256);
    std::vector<index_t> out_hist = mxx::allreduce(hist, comm);
    return out_hist;
}